

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

int __thiscall doctest::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  if (this->m_str != (char *)0x0) {
    free(this->m_str);
  }
  lVar1 = *(long *)dst;
  lVar4 = lVar1;
  if (lVar1 != 0) {
    lVar3 = lVar1 + -1;
    do {
      lVar4 = lVar3 + 1;
      pcVar2 = (char *)(lVar3 + 1);
      lVar3 = lVar4;
    } while (*pcVar2 != '\0');
  }
  pcVar2 = (char *)malloc((lVar4 - lVar1) + 1);
  this->m_str = pcVar2;
  pcVar2 = strcpy(pcVar2,*(char **)dst);
  return (int)pcVar2;
}

Assistant:

void String::copy(const String& other) {
    if(m_str)
        free(m_str);
    m_str = static_cast<char*>(malloc(detail::my_strlen(other.m_str) + 1));
    strcpy(m_str, other.m_str);
}